

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,IVec3 *srcSize,Vec3 *sq,Vec3 *tq,Vec3 *rq)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (float)dstSize->m_data[0];
  fVar2 = (float)dstSize->m_data[1];
  fVar1 = computeLodFromDerivates
                    (mode,((sq->m_data[2] - sq->m_data[0]) * (float)srcSize->m_data[0]) / fVar1,
                     ((tq->m_data[2] - tq->m_data[0]) * (float)srcSize->m_data[1]) / fVar1,
                     ((rq->m_data[2] - rq->m_data[0]) * (float)srcSize->m_data[2]) / fVar1,
                     ((sq->m_data[1] - sq->m_data[0]) * (float)srcSize->m_data[0]) / fVar2,
                     ((tq->m_data[1] - tq->m_data[0]) * (float)srcSize->m_data[1]) / fVar2,
                     ((rq->m_data[1] - rq->m_data[0]) * (float)srcSize->m_data[2]) / fVar2);
  return fVar1;
}

Assistant:

T						y			(void) const { DE_STATIC_ASSERT(Size >= 2); return m_data[1]; }